

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qmainwindowlayout_p.cpp
# Opt level: O0

void QMainWindowLayout::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 in_RCX;
  int in_EDX;
  int in_ESI;
  QMainWindowLayout *unaff_retaddr;
  QMainWindowLayout *_t;
  
  if (in_ESI == 0) {
    if (in_EDX == 0) {
      updateGapIndicator((QMainWindowLayout *)_o);
    }
    else if (in_EDX == 1) {
      tabChanged(unaff_retaddr);
    }
    else if (in_EDX == 2) {
      tabMoved((QMainWindowLayout *)0x2,(int)((ulong)in_RCX >> 0x20),(int)in_RCX);
    }
  }
  return;
}

Assistant:

void QMainWindowLayout::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QMainWindowLayout *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->updateGapIndicator(); break;
        case 1: _t->tabChanged(); break;
        case 2: _t->tabMoved((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        default: ;
        }
    }
}